

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall UI::renderButton(UI *this,char *label,int width,bool active)

{
  bool bVar1;
  bool bVar2;
  ImVec2 p0;
  ImVec2 local_38;
  ImVec2 local_30;
  
  ImGui::PushID(label);
  local_38 = ImGui::GetCursorScreenPos();
  local_30.x = (float)width;
  local_30.y = 1.0;
  bVar1 = ImGui::Button("##but",&local_30);
  bVar2 = ImGui::IsItemHovered(0);
  if (bVar2 || active) {
    ImGui::PushStyleColor(0,&(this->colors).buttonActiveFG);
  }
  ImGui::SetCursorScreenPos(&local_38);
  ImGui::Text("%s",label);
  ImGui::PopStyleColor((uint)(bVar2 || active));
  ImGui::PopID();
  return bVar1;
}

Assistant:

bool UI::renderButton(const char * label, int width, bool active) {
    int npop = 0;
    bool result = false;

    ImGui::PushID(label);
    const auto p0 = ImGui::GetCursorScreenPos();
    if (ImGui::Button("##but", ImVec2(width, 1))) {
        result = true;
    }
    if (ImGui::IsItemHovered() || active) {
        ImGui::PushStyleColor(ImGuiCol_Text, colors.buttonActiveFG);
        ++npop;
    }
    ImGui::SetCursorScreenPos(p0);
    ImGui::Text("%s", label);
    ImGui::PopStyleColor(npop);
    ImGui::PopID();

    return result;
}